

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicDispatchIndirect::Cleanup(BasicDispatchIndirect *this)

{
  BasicDispatchIndirect *this_local;
  
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_storage_buffer);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,2,this->m_dispatch_buffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteBuffers(1, &m_storage_buffer);
		glDeleteBuffers(2, m_dispatch_buffer);
		return NO_ERROR;
	}